

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

void __thiscall ON_PolylineCurve::Dump(ON_PolylineCurve *this,ON_TextLog *dump)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  ON_Interval d;
  ON_Interval local_40;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pdVar3 = ON_Interval::operator[](&local_40,0);
  dVar1 = *pdVar3;
  pdVar3 = ON_Interval::operator[](&local_40,1);
  ON_TextLog::Print(dump,"ON_PolylineCurve:  domain = [%g,%g]\n",dVar1,*pdVar3);
  iVar2 = ON_Polyline::PointCount(&this->m_pline);
  if (0 < iVar2) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      ON_TextLog::Print(dump,"  point[%2d] = ",uVar4 & 0xffffffff);
      ON_TextLog::Print(dump,(ON_3dPoint *)
                             ((long)&((this->m_pline).super_ON_3dPointArray.
                                      super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar5));
      ON_TextLog::Print(dump,", %g\n",(this->m_t).m_a[uVar4]);
      uVar4 = uVar4 + 1;
      iVar2 = ON_Polyline::PointCount(&this->m_pline);
      lVar5 = lVar5 + 0x18;
    } while ((long)uVar4 < (long)iVar2);
  }
  return;
}

Assistant:

void ON_PolylineCurve::Dump( ON_TextLog& dump ) const
{
  ON_Interval d = Domain();
  dump.Print( "ON_PolylineCurve:  domain = [%g,%g]\n",d[0],d[1]);
  for ( int i = 0; i < PointCount(); i++ ) {
    dump.Print( "  point[%2d] = ",i);
    dump.Print( m_pline[i] );
    dump.Print( ", %g\n",m_t[i]);
  }
}